

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Bool cff_blend_check_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  int iVar1;
  FT_Bool FVar2;
  
  FVar2 = '\x01';
  if (((blend->builtBV != '\0') && (blend->lastVsindex == vsindex)) && (blend->lenNDV == lenNDV)) {
    if ((lenNDV != 0) && (iVar1 = bcmp(NDV,blend->lastNDV,(ulong)lenNDV << 3), iVar1 != 0)) {
      return '\x01';
    }
    FVar2 = '\0';
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  cff_blend_check_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    if ( !blend->builtBV                                ||
         blend->lastVsindex != vsindex                  ||
         blend->lenNDV != lenNDV                        ||
         ( lenNDV                                     &&
           ft_memcmp( NDV,
                      blend->lastNDV,
                      lenNDV * sizeof ( *NDV ) ) != 0 ) )
    {
      /* need to build blend vector */
      return TRUE;
    }

    return FALSE;
  }